

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
UnBanIRCCommand::trigger
          (UnBanIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  unsigned_long uVar2;
  long *plVar3;
  char *pcVar4;
  string_view in_string;
  undefined8 uStack_30;
  
  in_string._M_str = (char *)channel._M_len;
  if (parameters._M_len == 0) {
    pcVar4 = "Error: Too Few Parameters. Syntax: unban <Ban ID>";
    uStack_30 = 0x31;
  }
  else {
    in_string._M_len = (size_t)parameters._M_str;
    uVar2 = Jupiter::from_string<unsigned_long>((Jupiter *)parameters._M_len,in_string);
    plVar3 = (long *)RenX::BanDatabase::getEntries();
    if (uVar2 < (ulong)(plVar3[1] - *plVar3 >> 3)) {
      cVar1 = RenX::BanDatabase::deactivate(RenX::banDatabase);
      if (cVar1 == '\0') {
        pcVar4 = "Error: Ban not active.";
        uStack_30 = 0x16;
      }
      else {
        pcVar4 = "Ban deactivated.";
        uStack_30 = 0x10;
      }
    }
    else {
      pcVar4 = "Error: Invalid ban ID; please find the ban ID using \"bansearch\".";
      uStack_30 = 0x40;
    }
  }
  Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,uStack_30,pcVar4);
  return;
}

Assistant:

void UnBanIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		size_t index = Jupiter::from_string<size_t>(parameters);
		if (index < RenX::banDatabase->getEntries().size())
		{
			if (RenX::banDatabase->deactivate(index))
				source->sendNotice(nick, "Ban deactivated."sv);
			else
				source->sendNotice(nick, "Error: Ban not active."sv);
		}
		else
			source->sendNotice(nick, "Error: Invalid ban ID; please find the ban ID using \"bansearch\"."sv);
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: unban <Ban ID>"sv);
}